

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu383.c
# Opt level: O0

MPP_RET hal_vp9d_release_res(HalVp9dCtx *hal)

{
  void *pvVar1;
  MPP_RET MVar2;
  uint local_30;
  RK_S32 i;
  RK_S32 ret;
  Vdpu383Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  HalVp9dCtx *hal_local;
  
  pvVar1 = hal->hw_ctx;
  if ((*(long *)((long)pvVar1 + 0xe8) == 0) ||
     (hal_local._4_4_ =
           mpp_buffer_put_with_caller(*(MppBuffer *)((long)pvVar1 + 0xe8),"hal_vp9d_release_res"),
     hal_local._4_4_ == MPP_OK)) {
    if ((*(long *)((long)pvVar1 + 0xd8) == 0) ||
       (hal_local._4_4_ =
             mpp_buffer_put_with_caller(*(MppBuffer *)((long)pvVar1 + 0xd8),"hal_vp9d_release_res"),
       hal_local._4_4_ == MPP_OK)) {
      if ((*(long *)((long)pvVar1 + 0xe0) == 0) ||
         (hal_local._4_4_ =
               mpp_buffer_put_with_caller
                         (*(MppBuffer *)((long)pvVar1 + 0xe0),"hal_vp9d_release_res"),
         hal_local._4_4_ == MPP_OK)) {
        for (local_30 = 0; (int)local_30 < 4; local_30 = local_30 + 1) {
          if ((*(long *)((long)pvVar1 + (long)(int)local_30 * 8 + 0x230) != 0) &&
             (MVar2 = mpp_buffer_put_with_caller
                                (*(MppBuffer *)((long)pvVar1 + (long)(int)local_30 * 8 + 0x230),
                                 "hal_vp9d_release_res"), MVar2 != MPP_OK)) {
            _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 prob_loop_base put buffer failed\n",(char *)0x0);
            return MVar2;
          }
        }
        if (hal->fast_mode == 0) {
          if ((*(long *)((long)pvVar1 + 0xc0) != 0) &&
             (MVar2 = mpp_buffer_put_with_caller
                                (*(MppBuffer *)((long)pvVar1 + 0xc0),"hal_vp9d_release_res"),
             MVar2 != MPP_OK)) {
            _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 global_base get buffer failed\n",(char *)0x0);
            return MVar2;
          }
          if ((*(long *)((long)pvVar1 + 200) != 0) &&
             (MVar2 = mpp_buffer_put_with_caller
                                (*(MppBuffer *)((long)pvVar1 + 200),"hal_vp9d_release_res"),
             MVar2 != MPP_OK)) {
            _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 probe_base get buffer failed\n",(char *)0x0);
            return MVar2;
          }
          if ((*(long *)((long)pvVar1 + 0xd0) != 0) &&
             (MVar2 = mpp_buffer_put_with_caller
                                (*(MppBuffer *)((long)pvVar1 + 0xd0),"hal_vp9d_release_res"),
             MVar2 != MPP_OK)) {
            _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 count_base put buffer failed\n",(char *)0x0);
            return MVar2;
          }
          if (*(long *)((long)pvVar1 + 0xf0) != 0) {
            mpp_osal_free("hal_vp9d_release_res",*(void **)((long)pvVar1 + 0xf0));
            *(undefined8 *)((long)pvVar1 + 0xf0) = 0;
          }
          if ((*(long *)((long)pvVar1 + 0x1f8) != 0) &&
             (MVar2 = mpp_buffer_put_with_caller
                                (*(MppBuffer *)((long)pvVar1 + 0x1f8),"hal_vp9d_release_res"),
             MVar2 != MPP_OK)) {
            _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 rcb_buf put buffer failed\n",(char *)0x0);
            return MVar2;
          }
        }
        else {
          for (local_30 = 0; (int)local_30 < 3; local_30 = local_30 + 1) {
            if ((*(long *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 8) != 0) &&
               (MVar2 = mpp_buffer_put_with_caller
                                  (*(MppBuffer *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 8),
                                   "hal_vp9d_release_res"), MVar2 != MPP_OK)) {
              _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 global_base put buffer failed\n",(char *)0x0);
              return MVar2;
            }
            if ((*(long *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x10) != 0) &&
               (MVar2 = mpp_buffer_put_with_caller
                                  (*(MppBuffer *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x10),
                                   "hal_vp9d_release_res"), MVar2 != MPP_OK)) {
              _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 probe_base put buffer failed\n",(char *)0x0);
              return MVar2;
            }
            if ((*(long *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x18) != 0) &&
               (MVar2 = mpp_buffer_put_with_caller
                                  (*(MppBuffer *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x18),
                                   "hal_vp9d_release_res"), MVar2 != MPP_OK)) {
              _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 count_base put buffer failed\n",(char *)0x0);
              return MVar2;
            }
            if (*(long *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x30) != 0) {
              mpp_osal_free("hal_vp9d_release_res",
                            *(void **)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x30));
              *(undefined8 *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x30) = 0;
            }
            if ((*(long *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x38) != 0) &&
               (MVar2 = mpp_buffer_put_with_caller
                                  (*(MppBuffer *)((long)pvVar1 + (long)(int)local_30 * 0x40 + 0x38),
                                   "hal_vp9d_release_res"), MVar2 != MPP_OK)) {
              _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 rcb_buf[%d] put buffer failed\n",(char *)0x0,
                         (ulong)local_30);
              return MVar2;
            }
          }
        }
        if ((*(long *)((long)pvVar1 + 0x208) == 0) ||
           (hal_local._4_4_ = hal_bufs_deinit(*(HalBufs *)((long)pvVar1 + 0x208)),
           hal_local._4_4_ == MPP_OK)) {
          if (*(long *)((long)pvVar1 + 0x218) != 0) {
            MVar2 = hal_bufs_deinit(*(HalBufs *)((long)pvVar1 + 0x218));
            if (MVar2 != MPP_OK) {
              _mpp_log_l(2,"hal_vp9d_vdpu383","thumb vp9 origin_bufs deinit buffer failed\n",
                         (char *)0x0);
              return MVar2;
            }
            *(undefined8 *)((long)pvVar1 + 0x218) = 0;
          }
          hal_local._4_4_ = MPP_OK;
        }
        else {
          _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 cmv bufs deinit buffer failed\n",(char *)0x0);
        }
      }
      else {
        _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 segid_last_base put buffer failed\n",(char *)0x0);
      }
    }
    else {
      _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 segid_cur_base put buffer failed\n",(char *)0x0);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp9d_vdpu383","vp9 probe_wr_base get buffer failed\n",(char *)0x0);
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_vp9d_release_res(HalVp9dCtx *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu383Vp9dCtx *hw_ctx = (Vdpu383Vp9dCtx*)p_hal->hw_ctx;
    RK_S32 ret = 0;
    RK_S32 i = 0;

    if (hw_ctx->prob_default_base) {
        ret = mpp_buffer_put(hw_ctx->prob_default_base);
        if (ret) {
            mpp_err("vp9 probe_wr_base get buffer failed\n");
            return ret;
        }
    }
    if (hw_ctx->segid_cur_base) {
        ret = mpp_buffer_put(hw_ctx->segid_cur_base);
        if (ret) {
            mpp_err("vp9 segid_cur_base put buffer failed\n");
            return ret;
        }
    }
    if (hw_ctx->segid_last_base) {
        ret = mpp_buffer_put(hw_ctx->segid_last_base);
        if (ret) {
            mpp_err("vp9 segid_last_base put buffer failed\n");
            return ret;
        }
    }
    for (i = 0; i < VP9_CONTEXT; i++) {
        if (hw_ctx->prob_loop_base[i]) {
            ret = mpp_buffer_put(hw_ctx->prob_loop_base[i]);
            if (ret) {
                mpp_err("vp9 prob_loop_base put buffer failed\n");
                return ret;
            }
        }
    }
    if (p_hal->fast_mode) {
        for (i = 0; i < MAX_GEN_REG; i++) {
            if (hw_ctx->g_buf[i].global_base) {
                ret = mpp_buffer_put(hw_ctx->g_buf[i].global_base);
                if (ret) {
                    mpp_err("vp9 global_base put buffer failed\n");
                    return ret;
                }
            }
            if (hw_ctx->g_buf[i].probe_base) {
                ret = mpp_buffer_put(hw_ctx->g_buf[i].probe_base);
                if (ret) {
                    mpp_err("vp9 probe_base put buffer failed\n");
                    return ret;
                }
            }
            if (hw_ctx->g_buf[i].count_base) {
                ret = mpp_buffer_put(hw_ctx->g_buf[i].count_base);
                if (ret) {
                    mpp_err("vp9 count_base put buffer failed\n");
                    return ret;
                }
            }
            if (hw_ctx->g_buf[i].hw_regs) {
                mpp_free(hw_ctx->g_buf[i].hw_regs);
                hw_ctx->g_buf[i].hw_regs = NULL;
            }
            if (hw_ctx->g_buf[i].rcb_buf) {
                ret = mpp_buffer_put(hw_ctx->g_buf[i].rcb_buf);
                if (ret) {
                    mpp_err("vp9 rcb_buf[%d] put buffer failed\n", i);
                    return ret;
                }
            }
        }
    } else {
        if (hw_ctx->global_base) {
            ret = mpp_buffer_put(hw_ctx->global_base);
            if (ret) {
                mpp_err("vp9 global_base get buffer failed\n");
                return ret;
            }
        }
        if (hw_ctx->probe_base) {
            ret = mpp_buffer_put(hw_ctx->probe_base);
            if (ret) {
                mpp_err("vp9 probe_base get buffer failed\n");
                return ret;
            }
        }
        if (hw_ctx->count_base) {
            ret = mpp_buffer_put(hw_ctx->count_base);
            if (ret) {
                mpp_err("vp9 count_base put buffer failed\n");
                return ret;
            }
        }
        if (hw_ctx->hw_regs) {
            mpp_free(hw_ctx->hw_regs);
            hw_ctx->hw_regs = NULL;
        }
        if (hw_ctx->rcb_buf) {
            ret = mpp_buffer_put(hw_ctx->rcb_buf);
            if (ret) {
                mpp_err("vp9 rcb_buf put buffer failed\n");
                return ret;
            }
        }
    }

    if (hw_ctx->cmv_bufs) {
        ret = hal_bufs_deinit(hw_ctx->cmv_bufs);
        if (ret) {
            mpp_err("vp9 cmv bufs deinit buffer failed\n");
            return ret;
        }
    }
    if (hw_ctx->origin_bufs) {
        ret = hal_bufs_deinit(hw_ctx->origin_bufs);
        if (ret) {
            mpp_err("thumb vp9 origin_bufs deinit buffer failed\n");
            return ret;
        }
        hw_ctx->origin_bufs = NULL;
    }

    return MPP_OK;
}